

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::RepeatedPrimitiveFieldGenerator::GenerateSerializeWithCachedSizes
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  Type type;
  int iVar2;
  char *text;
  
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    variables = &this->variables_;
    io::Printer::Print(printer,variables,
                       "if (this->$name$_size() > 0) {\n  ::google::protobuf::internal::WireFormatLite::WriteTag($number$, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);\n  output->WriteVarint32(_$name$_cached_byte_size_);\n"
                      );
    type = FieldDescriptor::type(this->descriptor_);
    iVar2 = anon_unknown_3::FixedSize(type);
    if (0 < iVar2) {
      io::Printer::Print(printer,variables,
                         "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$Array(\n    this->$name$().data(), this->$name$_size(), output);\n"
                        );
      io::Printer::Print(printer,variables,"}\n");
      return;
    }
    io::Printer::Print(printer,variables,"}\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "for (int i = 0, n = this->$name$_size(); i < n; i++) {\n");
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  text = 
  "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$(\n    $number$, this->$name$(i), output);\n"
  ;
  if (bVar1) {
    text = 
    "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$NoTag(\n    this->$name$(i), output);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) const {
  bool array_written = false;
  if (descriptor_->is_packed()) {
    // Write the tag and the size.
    printer->Print(variables_,
      "if (this->$name$_size() > 0) {\n"
      "  ::google::protobuf::internal::WireFormatLite::WriteTag("
          "$number$, "
          "::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, "
          "output);\n"
      "  output->WriteVarint32(_$name$_cached_byte_size_);\n");

    if (FixedSize(descriptor_->type()) > 0) {
      // TODO(ckennelly): Use RepeatedField<T>::unsafe_data() via
      // WireFormatLite to access the contents of this->$name$_ to save a branch
      // here.
      printer->Print(variables_,
        "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$Array(\n"
        "    this->$name$().data(), this->$name$_size(), output);\n");
      array_written = true;  // Wrote array all at once
    }
    printer->Print(variables_, "}\n");
  }
  if (!array_written) {
    printer->Print(variables_,
        "for (int i = 0, n = this->$name$_size(); i < n; i++) {\n");
    if (descriptor_->is_packed()) {
      printer->Print(variables_,
        "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$NoTag(\n"
        "    this->$name$(i), output);\n");
    } else {
      printer->Print(variables_,
        "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$(\n"
        "    $number$, this->$name$(i), output);\n");
    }
    printer->Print("}\n");
  }
}